

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendMeters(VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  Distance *pDVar2;
  undefined4 in_EDX;
  long in_RDI;
  string *unaff_retaddr;
  optional<metaf::Distance> v;
  Distance *in_stack_ffffffffffffffd0;
  bool local_1;
  
  Distance::fromMeterString(unaff_retaddr);
  bVar1 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x244634);
  if (bVar1) {
    std::optional<metaf::Distance>::operator->((optional<metaf::Distance> *)0x244649);
    bVar1 = Distance::isReported(in_stack_ffffffffffffffd0);
    if (bVar1) {
      pDVar2 = std::optional<metaf::Distance>::operator*((optional<metaf::Distance> *)0x244666);
      *(undefined8 *)(in_RDI + 4) = *(undefined8 *)pDVar2;
      *(undefined8 *)(in_RDI + 0xc) =
           *(undefined8 *)
            &(pDVar2->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged;
      *(undefined4 *)(in_RDI + 0x58) = in_EDX;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VisibilityGroup::appendMeters(const std::string & group, IncompleteText next) {
	const auto v = Distance::fromMeterString(group);
	if (!v.has_value()) return false;
	if (!v->isReported()) return false;
	vis = *v;
	incompleteText = next;
	return true;
}